

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::SignFun::GetFunctions(void)

{
  LogicalType *type;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *this;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_201;
  ScalarFunctionSet *local_200;
  ScalarFunctionSet *local_1f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1f0;
  LogicalType local_1d8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c0;
  scalar_function_t local_1a8;
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  ScalarFunction local_158;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_200 = in_RDI;
  duckdb::LogicalType::Numeric();
  local_1f8 = in_RDI + 0x20;
  for (this = (ScalarFunction *)
              local_1f0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
      this != (ScalarFunction *)
              local_1f0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish; this = (ScalarFunction *)&this->field_0x18) {
    if (this->super_BaseScalarFunction != (BaseScalarFunction)0x15) {
      duckdb::LogicalType::LogicalType(local_170,(LogicalType *)this);
      __l._M_len = 1;
      __l._M_array = local_170;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1c0,__l,&local_201);
      duckdb::LogicalType::LogicalType(local_1d8,TINYINT);
      ScalarFunction::GetScalarUnaryFunctionFixedReturn<signed_char,duckdb::SignOperator>
                (&local_1a8,this,type);
      duckdb::LogicalType::LogicalType(local_188,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&local_158,&local_1c0,local_1d8,&local_1a8,0,0,0,0,local_188,0,0,0);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 local_1f8,&local_158);
      ScalarFunction::~ScalarFunction(&local_158);
      duckdb::LogicalType::~LogicalType(local_188);
      std::_Function_base::~_Function_base(&local_1a8.super__Function_base);
      duckdb::LogicalType::~LogicalType(local_1d8);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1c0);
      duckdb::LogicalType::~LogicalType(local_170);
    }
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1f0);
  return local_200;
}

Assistant:

ScalarFunctionSet SignFun::GetFunctions() {
	ScalarFunctionSet sign;
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			continue;
		} else {
			sign.AddFunction(
			    ScalarFunction({type}, LogicalType::TINYINT,
			                   ScalarFunction::GetScalarUnaryFunctionFixedReturn<int8_t, SignOperator>(type)));
		}
	}
	return sign;
}